

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  LodePNGColorType colortype;
  uchar uVar1;
  unsigned_short gray;
  uchar uVar5;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uchar uVar7;
  uchar uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  uchar *puVar13;
  LodePNGColorMode *pLVar14;
  ulong numpixels;
  size_t __n;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_e0;
  unsigned_short local_de;
  unsigned_short local_dc;
  unsigned_short local_da;
  uchar *local_d8;
  LodePNGColorMode *local_d0;
  LodePNGColorMode *local_c8;
  uchar *local_c0;
  ColorTree local_b8;
  uchar uVar6;
  
  colortype = mode_in->colortype;
  if ((colortype == LCT_PALETTE) && (mode_in->palette == (uchar *)0x0)) {
    return 0x6b;
  }
  numpixels = (ulong)h * (ulong)w;
  local_d8 = out;
  local_c0 = in;
  iVar2 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar2 != 0) {
    uVar4 = mode_in->bitdepth;
    uVar3 = getNumColorChannels(colortype);
    uVar9 = (ulong)(uVar3 * uVar4);
    __n = (((uint)numpixels & 7) * uVar9 + 7 >> 3) + (numpixels >> 3) * uVar9;
joined_r0x0011e6cc:
    if (__n == 0) {
      return 0;
    }
    memcpy(local_d8,local_c0,__n);
    return 0;
  }
  local_d0 = mode_out;
  local_c8 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar9 = mode_out->palettesize;
    uVar11 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    if (uVar9 == 0) {
      puVar13 = mode_in->palette;
      uVar9 = mode_in->palettesize;
      if ((colortype == LCT_PALETTE) && (mode_in->bitdepth == mode_out->bitdepth)) {
        __n = lodepng_get_raw_size(w,h,mode_in);
        goto joined_r0x0011e6cc;
      }
      if (uVar9 < uVar11) {
        uVar11 = uVar9;
      }
      local_b8.children[0xe] = (ColorTree *)0x0;
      local_b8.children[0xf] = (ColorTree *)0x0;
      local_b8.children[0xc] = (ColorTree *)0x0;
      local_b8.children[0xd] = (ColorTree *)0x0;
      local_b8.children[10] = (ColorTree *)0x0;
      local_b8.children[0xb] = (ColorTree *)0x0;
      local_b8.children[8] = (ColorTree *)0x0;
      local_b8.children[9] = (ColorTree *)0x0;
      local_b8.children[6] = (ColorTree *)0x0;
      local_b8.children[7] = (ColorTree *)0x0;
      local_b8.children[4] = (ColorTree *)0x0;
      local_b8.children[5] = (ColorTree *)0x0;
      local_b8.children[2] = (ColorTree *)0x0;
      local_b8.children[3] = (ColorTree *)0x0;
      local_b8.children[0] = (ColorTree *)0x0;
      local_b8.children[1] = (ColorTree *)0x0;
      local_b8.index = -1;
      if (uVar9 == 0) goto LAB_0011e834;
    }
    else {
      puVar13 = mode_out->palette;
      if (uVar9 < uVar11) {
        uVar11 = uVar9;
      }
    }
    local_b8.index = -1;
    local_b8.children[0xf] = (ColorTree *)0x0;
    local_b8.children[0xe] = (ColorTree *)0x0;
    local_b8.children[0xd] = (ColorTree *)0x0;
    local_b8.children[0xc] = (ColorTree *)0x0;
    local_b8.children[0xb] = (ColorTree *)0x0;
    local_b8.children[10] = (ColorTree *)0x0;
    local_b8.children[9] = (ColorTree *)0x0;
    local_b8.children[8] = (ColorTree *)0x0;
    local_b8.children[7] = (ColorTree *)0x0;
    local_b8.children[6] = (ColorTree *)0x0;
    local_b8.children[5] = (ColorTree *)0x0;
    local_b8.children[4] = (ColorTree *)0x0;
    local_b8.children[3] = (ColorTree *)0x0;
    local_b8.children[2] = (ColorTree *)0x0;
    local_b8.children[1] = (ColorTree *)0x0;
    local_b8.children[0] = (ColorTree *)0x0;
    uVar9 = 0;
    do {
      uVar4 = color_tree_add(&local_b8,puVar13[uVar9 * 4],puVar13[uVar9 * 4 + 1],
                             puVar13[uVar9 * 4 + 2],puVar13[uVar9 * 4 + 3],(uint)uVar9);
      pLVar14 = local_d0;
      if (uVar4 != 0) goto LAB_0011eb99;
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
LAB_0011e834:
  puVar13 = local_c0;
  pLVar14 = local_d0;
  if (local_d0->bitdepth == 0x10 && local_c8->bitdepth == 0x10) {
    if (numpixels != 0) {
      lVar12 = 0;
      sVar10 = 0;
      do {
        local_da = 0;
        local_dc = 0;
        local_de = 0;
        local_e0 = 0;
        getPixelColorRGBA16(&local_da,&local_dc,&local_de,&local_e0,puVar13,sVar10,local_c8);
        uVar1 = (uchar)local_da;
        uVar5 = (uchar)(local_da >> 8);
        uVar7 = (uchar)(local_e0 >> 8);
        uVar8 = (uchar)(local_dc >> 8);
        uVar6 = (uchar)(local_de >> 8);
        switch(local_d0->colortype) {
        case LCT_GREY:
          *(unsigned_short *)(local_d8 + sVar10 * 2) = local_da << 8 | local_da >> 8;
          break;
        case LCT_RGB:
          local_d8[lVar12 * 2] = uVar5;
          local_d8[lVar12 * 2 + 1] = uVar1;
          local_d8[lVar12 * 2 + 2] = uVar8;
          local_d8[lVar12 * 2 + 3] = (uchar)local_dc;
          local_d8[lVar12 * 2 + 4] = uVar6;
          local_d8[lVar12 * 2 + 5] = (uchar)local_de;
          break;
        case LCT_GREY_ALPHA:
          local_d8[sVar10 * 4] = uVar5;
          local_d8[sVar10 * 4 + 1] = uVar1;
          local_d8[sVar10 * 4 + 2] = uVar7;
          local_d8[sVar10 * 4 + 3] = (uchar)local_e0;
          break;
        case LCT_RGBA:
          local_d8[sVar10 * 8] = uVar5;
          local_d8[sVar10 * 8 + 1] = uVar1;
          local_d8[sVar10 * 8 + 2] = uVar8;
          local_d8[sVar10 * 8 + 3] = (uchar)local_dc;
          local_d8[sVar10 * 8 + 4] = uVar6;
          local_d8[sVar10 * 8 + 5] = (uchar)local_de;
          local_d8[sVar10 * 8 + 6] = uVar7;
          local_d8[sVar10 * 8 + 7] = (uchar)local_e0;
        }
        sVar10 = sVar10 + 1;
        lVar12 = lVar12 + 3;
      } while (numpixels - sVar10 != 0);
      uVar4 = 0;
      pLVar14 = local_d0;
      goto LAB_0011eb99;
    }
  }
  else if (local_d0->bitdepth == 8) {
    if (local_d0->colortype == LCT_RGB) {
      getPixelColorsRGB8(local_d8,numpixels,local_c0,local_c8);
    }
    else {
      if (local_d0->colortype != LCT_RGBA) goto LAB_0011e98d;
      getPixelColorsRGBA8(local_d8,numpixels,local_c0,local_c8);
    }
  }
  else {
LAB_0011e98d:
    uVar4 = 0;
    local_da = local_da & 0xff00;
    local_dc = local_dc & 0xff00;
    local_de = local_de & 0xff00;
    local_e0 = local_e0 & 0xff00;
    if (numpixels == 0) goto LAB_0011eb99;
    sVar10 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_da,(uchar *)&local_dc,(uchar *)&local_de,(uchar *)&local_e0
                         ,puVar13,sVar10,local_c8);
      switch(pLVar14->colortype) {
      case LCT_GREY:
        uVar3 = pLVar14->bitdepth;
        if (uVar3 == 0x10) {
          local_d8[sVar10 * 2 + 1] = (byte)local_da;
          local_d8[sVar10 * 2] = (byte)local_da;
        }
        else if (uVar3 == 8) {
          local_d8[sVar10] = (byte)local_da;
        }
        else {
          uVar4 = ~(-1 << ((byte)uVar3 & 0x1f)) & (uint)((byte)local_da >> (8 - (byte)uVar3 & 0x1f))
          ;
LAB_0011eb5a:
          addColorBits(local_d8,sVar10,uVar3,uVar4);
        }
        break;
      case LCT_RGB:
        lVar12 = sVar10 * 3;
        if (pLVar14->bitdepth == 8) {
          local_d8[lVar12] = (byte)local_da;
          local_d8[lVar12 + 1] = (uchar)local_dc;
          local_d8[lVar12 + 2] = (uchar)local_de;
        }
        else {
          local_d8[sVar10 * 6 + 1] = (byte)local_da;
          local_d8[sVar10 * 6] = (byte)local_da;
          local_d8[sVar10 * 6 + 3] = (uchar)local_dc;
          local_d8[sVar10 * 6 + 2] = (uchar)local_dc;
          local_d8[sVar10 * 6 + 5] = (uchar)local_de;
          local_d8[sVar10 * 6 + 4] = (uchar)local_de;
        }
        break;
      case LCT_PALETTE:
        uVar4 = color_tree_get(&local_b8,(byte)local_da,(uchar)local_dc,(uchar)local_de,
                               (uchar)local_e0);
        if ((int)uVar4 < 0) {
          uVar4 = 0x52;
          goto LAB_0011eb99;
        }
        uVar3 = pLVar14->bitdepth;
        if (uVar3 != 8) goto LAB_0011eb5a;
        local_d8[sVar10] = (uchar)uVar4;
        break;
      case LCT_GREY_ALPHA:
        if (pLVar14->bitdepth == 0x10) {
          local_d8[sVar10 * 4 + 1] = (byte)local_da;
          local_d8[sVar10 * 4] = (byte)local_da;
          local_d8[sVar10 * 4 + 3] = (uchar)local_e0;
          local_d8[sVar10 * 4 + 2] = (uchar)local_e0;
        }
        else if (pLVar14->bitdepth == 8) {
          local_d8[sVar10 * 2] = (byte)local_da;
          local_d8[sVar10 * 2 + 1] = (uchar)local_e0;
        }
        break;
      case LCT_RGBA:
        if (pLVar14->bitdepth == 8) {
          local_d8[sVar10 * 4] = (byte)local_da;
          local_d8[sVar10 * 4 + 1] = (uchar)local_dc;
          local_d8[sVar10 * 4 + 2] = (uchar)local_de;
          local_d8[sVar10 * 4 + 3] = (uchar)local_e0;
        }
        else {
          local_d8[sVar10 * 8 + 1] = (byte)local_da;
          local_d8[sVar10 * 8] = (byte)local_da;
          local_d8[sVar10 * 8 + 3] = (uchar)local_dc;
          local_d8[sVar10 * 8 + 2] = (uchar)local_dc;
          local_d8[sVar10 * 8 + 5] = (uchar)local_de;
          local_d8[sVar10 * 8 + 4] = (uchar)local_de;
          local_d8[sVar10 * 8 + 7] = (uchar)local_e0;
          local_d8[sVar10 * 8 + 6] = (uchar)local_e0;
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != numpixels);
  }
  uVar4 = 0;
LAB_0011eb99:
  if (pLVar14->colortype == LCT_PALETTE) {
    color_tree_cleanup(&local_b8);
  }
  return uVar4;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  if(mode_in->colortype == LCT_PALETTE && !mode_in->palette) {
    return 107; /* error: must provide palette if input mode is palette */
  }

  if(lodepng_color_mode_equal(mode_out, mode_in)) {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    lodepng_memcpy(out, in, numbytes);
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE) {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = (size_t)1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0) {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
      /*if the input was also palette with same bitdepth, then the color types are also
      equal, so copy literally. This to preserve the exact indices that were in the PNG
      even in case there are duplicate colors in the palette.*/
      if(mode_in->colortype == LCT_PALETTE && mode_in->bitdepth == mode_out->bitdepth) {
        size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
        lodepng_memcpy(out, in, numbytes);
        return 0;
      }
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i) {
      const unsigned char* p = &palette[i * 4];
      error = color_tree_add(&tree, p[0], p[1], p[2], p[3], (unsigned)i);
      if(error) break;
    }
  }

  if(!error) {
    if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i) {
        unsigned short r = 0, g = 0, b = 0, a = 0;
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        rgba16ToPixel(out, i, mode_out, r, g, b, a);
      }
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA) {
      getPixelColorsRGBA8(out, numpixels, in, mode_in);
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB) {
      getPixelColorsRGB8(out, numpixels, in, mode_in);
    } else {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
        if(error) break;
      }
    }
  }

  if(mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }

  return error;
}